

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

bool __thiscall
Imath_3_2::Matrix44<float>::equalWithAbsError(Matrix44<float> *this,Matrix44<float> *m,float e)

{
  float fVar1;
  float fVar2;
  int i;
  ulong uVar3;
  int j;
  long lVar4;
  
  for (uVar3 = 0; uVar3 != 4; uVar3 = uVar3 + 1) {
    lVar4 = 0;
    while (lVar4 != 4) {
      fVar1 = (*(float (*) [4])*(float (*) [4])this)[lVar4];
      fVar2 = (*(float (*) [4])*(float (*) [4])m)[lVar4];
      lVar4 = lVar4 + 1;
      if (e < (float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                     (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1))) goto LAB_0012cb19;
    }
    this = (Matrix44<float> *)((long)this + 0x10);
    m = (Matrix44<float> *)((long)m + 0x10);
  }
LAB_0012cb19:
  return 3 < uVar3;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline bool
Matrix44<T>::equalWithAbsError (const Matrix44<T>& m, T e) const IMATH_NOEXCEPT
{
    for (int i = 0; i < 4; i++)
        for (int j = 0; j < 4; j++)
            if (!IMATH_INTERNAL_NAMESPACE::equalWithAbsError (
                    (*this).x[i][j], m.x[i][j], e))
                return false;

    return true;
}